

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_info.cpp
# Opt level: O0

void refresh_mem_info(void)

{
  istream *piVar1;
  string local_3c8 [8];
  string s;
  stringstream local_398 [8];
  stringstream ss;
  istream local_210 [8];
  ifstream file;
  
  std::ifstream::ifstream(local_210);
  std::__cxx11::stringstream::stringstream(local_398);
  std::__cxx11::string::string(local_3c8);
  std::ifstream::open((char *)local_210,0x1bf08f);
  piVar1 = std::operator>>(local_210,local_3c8);
  piVar1 = (istream *)std::istream::operator>>(piVar1,&mem_total);
  piVar1 = std::operator>>(piVar1,local_3c8);
  piVar1 = std::operator>>(piVar1,local_3c8);
  piVar1 = (istream *)std::istream::operator>>(piVar1,&mem_free);
  piVar1 = std::operator>>(piVar1,local_3c8);
  piVar1 = std::operator>>(piVar1,local_3c8);
  std::istream::operator>>(piVar1,&mem_available);
  std::__cxx11::string::~string(local_3c8);
  std::__cxx11::stringstream::~stringstream(local_398);
  std::ifstream::~ifstream(local_210);
  return;
}

Assistant:

static void refresh_mem_info() {
    std::ifstream file;
    std::stringstream ss;
    std::string s;

    file.open("/proc/meminfo", std::fstream::in);
    file >> s >> mem_total >> s >> s >> mem_free >> s >> s >> mem_available;
}